

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O2

void ggml_compute_forward_soft_max_ext_back(ggml_compute_params *params,ggml_tensor *dst)

{
  int iVar1;
  int n;
  ggml_tensor *pgVar2;
  ggml_tensor *pgVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  undefined8 uVar8;
  float *y;
  float *x;
  long lVar9;
  float *y_00;
  undefined1 auVar10 [16];
  float local_50;
  float local_4c;
  ggml_tensor *local_48;
  ggml_tensor *local_40;
  long local_38;
  
  pgVar2 = dst->src[0];
  if (pgVar2->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x12f9,"fatal error");
  }
  pgVar3 = dst->src[1];
  cVar4 = ggml_is_contiguous(pgVar2);
  if (cVar4 == '\0') {
    pcVar7 = "ggml_is_contiguous(src0)";
    uVar8 = 0x129f;
  }
  else {
    cVar4 = ggml_is_contiguous(pgVar3);
    if (cVar4 == '\0') {
      pcVar7 = "ggml_is_contiguous(src1)";
      uVar8 = 0x12a0;
    }
    else {
      cVar4 = ggml_is_contiguous(dst);
      if (cVar4 == '\0') {
        pcVar7 = "ggml_is_contiguous(dst)";
        uVar8 = 0x12a1;
      }
      else {
        cVar4 = ggml_are_same_shape(pgVar2,dst);
        if (cVar4 == '\0') {
          pcVar7 = "ggml_are_same_shape(src0, dst)";
          uVar8 = 0x12a2;
        }
        else {
          cVar4 = ggml_are_same_shape(pgVar3,dst);
          if (cVar4 == '\0') {
            pcVar7 = "ggml_are_same_shape(src1, dst)";
            uVar8 = 0x12a3;
          }
          else {
            local_40 = pgVar3;
            if (((float)dst->op_params[1] == 0.0) && (!NAN((float)dst->op_params[1]))) {
              local_4c = (float)dst->op_params[0];
              iVar1 = params->ith;
              iVar6 = params->nth;
              n = (int)pgVar2->ne[0];
              local_48 = pgVar2;
              iVar5 = ggml_nrows(pgVar2);
              iVar6 = (iVar6 + -1 + iVar5) / iVar6;
              lVar9 = (long)iVar1 * (long)iVar6;
              iVar6 = iVar6 + (int)lVar9;
              if (iVar5 <= iVar6) {
                iVar6 = iVar5;
              }
              local_38 = (long)iVar6;
              for (; lVar9 < local_38; lVar9 = lVar9 + 1) {
                y = (float *)(dst->nb[1] * lVar9 + (long)dst->data);
                x = (float *)(local_40->nb[1] * lVar9 + (long)local_40->data);
                y_00 = (float *)(local_48->nb[1] * lVar9 + (long)local_48->data);
                local_50 = 0.0;
                ggml_vec_dot_f32(n,&local_50,0,x,0,y_00,0,1);
                ggml_vec_cpy_f32(n,y,y_00);
                auVar10._8_4_ = 0x80000000;
                auVar10._0_8_ = 0x8000000080000000;
                auVar10._12_4_ = 0x80000000;
                auVar10 = vxorps_avx512vl(ZEXT416((uint)local_50),auVar10);
                ggml_vec_acc1_f32(n,y,auVar10._0_4_);
                ggml_vec_mul_f32(n,y,y,x);
                ggml_vec_scale_f32(n,y,local_4c);
              }
              return;
            }
            pcVar7 = "max_bias == 0.0f";
            uVar8 = 0x12ab;
          }
        }
      }
    }
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar8,"GGML_ASSERT(%s) failed",pcVar7);
}

Assistant:

void ggml_compute_forward_soft_max_ext_back(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_soft_max_ext_back_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}